

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O2

void __thiscall
Diligent::VariableSizeAllocationsManager::DbgVerifyList(VariableSizeAllocationsManager *this)

{
  char (*Args_1) [30];
  _Rb_tree_header *p_Var1;
  OffsetType *Args;
  ulong uVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  char (*Args_1_00) [74];
  _Base_ptr Args_1_01;
  OffsetType *in_R8;
  _Rb_tree_node_base *p_Var6;
  string msg;
  char (*in_stack_ffffffffffffff98) [9];
  string local_58;
  char (*local_38) [28];
  
  Args_1 = (char (*) [30])(this->m_CurrAlignment - 1);
  if ((char (*) [30])(this->m_CurrAlignment ^ (ulong)Args_1) <= Args_1) {
    FormatString<char[26],char[30]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(m_CurrAlignment)",Args_1);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c3);
    std::__cxx11::string::~string((string *)&local_58);
  }
  p_Var5 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[26],char[57]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
               (char (*) [57])this);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c6);
    std::__cxx11::string::~string((string *)&local_58);
  }
  Args = &this->m_CurrAlignment;
  p_Var1 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  local_38 = (char (*) [28])0x0;
  p_Var6 = &p_Var1->_M_header;
  while ((_Rb_tree_header *)p_Var5 != p_Var1) {
    p_Var4 = p_Var5 + 1;
    uVar2 = *(ulong *)(p_Var5 + 1);
    Args_1_00 = (char (*) [74])((long)&(p_Var5[1]._M_parent)->_M_color + uVar2);
    if ((char (*) [74])this->m_MaxSize < Args_1_00) {
      FormatString<char[26],char[74]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize",
                 Args_1_00);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1c9);
      std::__cxx11::string::~string((string *)&local_58);
      uVar2 = *(ulong *)p_Var4;
    }
    if ((*Args - 1 & uVar2) != 0) {
      in_R8 = Args;
      FormatString<char[15],unsigned_long,char[10],unsigned_long,char[9]>
                (&local_58,(Diligent *)"Block offset (",(char (*) [15])p_Var4,
                 (unsigned_long *)") is not ",(char (*) [10])Args,(unsigned_long *)0x5c0fd4,
                 in_stack_ffffffffffffff98);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1ca);
      std::__cxx11::string::~string((string *)&local_58);
      uVar2 = *(ulong *)p_Var4;
    }
    Args_1_01 = p_Var5[1]._M_parent;
    if (((char *)((long)&Args_1_01->_M_color + uVar2) < (char *)this->m_MaxSize) &&
       ((*Args - 1 & (ulong)Args_1_01) != 0)) {
      FormatString<char[49],unsigned_long,char[9]>
                (&local_58,(Diligent *)"All block sizes except for the last one must be ",
                 (char (*) [49])Args,(unsigned_long *)0x5c0fd4,(char (*) [9])in_R8);
      Args_1_01 = (_Base_ptr)0x1cc;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1cc);
      std::__cxx11::string::~string((string *)&local_58);
    }
    p_Var3 = p_Var5[1]._M_left;
    if (p_Var5 != p_Var3[1]._M_parent) {
      FormatString<char[26],char[49]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BlockIt == BlockIt->second.OrderBySizeIt->second",
                 (char (*) [49])Args_1_01);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1cd);
      std::__cxx11::string::~string((string *)&local_58);
      p_Var3 = p_Var5[1]._M_left;
    }
    if (p_Var5[1]._M_parent != *(_Base_ptr *)(p_Var3 + 1)) {
      FormatString<char[26],char[61]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first",
                 (char (*) [61])p_Var5[1]._M_parent);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1ce);
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (*(ulong *)p_Var4 <= (long)&(p_Var6[1]._M_parent)->_M_color + *(size_t *)(p_Var6 + 1))) {
      FormatString<char[49]>
                (&local_58,(char (*) [49])"Unmerged adjacent or overlapping blocks detected");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1d3);
      std::__cxx11::string::~string((string *)&local_58);
    }
    local_38 = (char (*) [28])((long)&(p_Var5[1]._M_parent)->_M_color + (long)local_38);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    p_Var6 = p_Var5;
    p_Var5 = p_Var4;
  }
  for (p_Var5 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (*(_Base_ptr *)(p_Var5 + 1) != p_Var5[1]._M_parent[1]._M_parent) {
      FormatString<char[26],char[47]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"OrderIt->first == OrderIt->second->second.Size",
                 (char (*) [47])p_Var5[1]._M_parent);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1dd);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  if (local_38 != (char (*) [28])this->m_FreeSize) {
    FormatString<char[26],char[28]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TotalFreeSize == m_FreeSize",local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1e1);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void DbgVerifyList()
    {
        OffsetType TotalFreeSize = 0;

        VERIFY_EXPR(IsPowerOfTwo(m_CurrAlignment));
        auto BlockIt     = m_FreeBlocksByOffset.begin();
        auto PrevBlockIt = m_FreeBlocksByOffset.end();
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        while (BlockIt != m_FreeBlocksByOffset.end())
        {
            VERIFY_EXPR(BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize);
            VERIFY((BlockIt->first & (m_CurrAlignment - 1)) == 0, "Block offset (", BlockIt->first, ") is not ", m_CurrAlignment, "-aligned");
            if (BlockIt->first + BlockIt->second.Size < m_MaxSize)
                VERIFY((BlockIt->second.Size & (m_CurrAlignment - 1)) == 0, "All block sizes except for the last one must be ", m_CurrAlignment, "-aligned");
            VERIFY_EXPR(BlockIt == BlockIt->second.OrderBySizeIt->second);
            VERIFY_EXPR(BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first);
            //   PrevBlock.Offset                   BlockIt.first
            //     |                                  |
            // ~ ~ |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~
            //
            VERIFY(PrevBlockIt == m_FreeBlocksByOffset.end() || BlockIt->first > PrevBlockIt->first + PrevBlockIt->second.Size, "Unmerged adjacent or overlapping blocks detected");
            TotalFreeSize += BlockIt->second.Size;

            PrevBlockIt = BlockIt;
            ++BlockIt;
        }

        auto OrderIt = m_FreeBlocksBySize.begin();
        while (OrderIt != m_FreeBlocksBySize.end())
        {
            VERIFY_EXPR(OrderIt->first == OrderIt->second->second.Size);
            ++OrderIt;
        }

        VERIFY_EXPR(TotalFreeSize == m_FreeSize);
    }